

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O2

bool death_prog_trophy_belt(OBJ_DATA *belt,CHAR_DATA *ch)

{
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *obj;
  
  if (belt->value[4] != 0) {
    extract_obj(belt);
    pObjIndex = get_obj_index(0x5c5d);
    obj = create_object(pObjIndex,0);
    obj_to_char(obj,ch);
    equip_char(ch,obj,0xd,false);
    free_trophy(ch->pcdata->trophy);
    obj->value[4] = 0;
  }
  return false;
}

Assistant:

bool death_prog_trophy_belt(OBJ_DATA *belt, CHAR_DATA *ch)
{
	OBJ_DATA *newbelt;

	if (!belt->value[4])
		return false;

	extract_obj(belt);

	newbelt = create_object(get_obj_index(23645), 0);
	obj_to_char(newbelt, ch);
	equip_char(ch, newbelt, WEAR_WAIST, false);

	free_trophy(ch->pcdata->trophy);

	newbelt->value[4] = 0;
	return false;
}